

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Obj_t * Gia_ManFraigMarkCos(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGStack_18;
  int fMark_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  pGStack_18 = pObj;
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0xed,"Gia_Obj_t *Gia_ManFraigMarkCos(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  while (iVar1 = Gia_ObjIsCo(pGStack_18), iVar1 != 0) {
    if (fMark != 0) {
      Gia_ObjSetTravIdCurrent(p,pGStack_18);
      pObj_00 = Gia_ObjFanin0(pGStack_18);
      Gia_ObjSetTravIdCurrent(p,pObj_00);
    }
    pGStack_18 = pGStack_18 + -1;
  }
  return pGStack_18;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCos( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCo(pObj) ); Gia_ObjIsCo(pObj); pObj-- )
        if ( fMark )
        {
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
    return pObj;
}